

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

Error uv11::write2(WriteRequest *req,Stream *stream,Buffer *bufs,uint nbufs,Stream *send_handle,
                  WriteCb *write_cb)

{
  WriteCb *this;
  _Manager_type p_Var1;
  int s;
  Error EVar3;
  error_category *peVar4;
  error_code eVar2;
  
  this = &req->write_cb;
  std::function<void_(uv11::WriteRequest_&,_std::error_code)>::operator=(this,write_cb);
  s = uv_write2(req,stream->stream_ptr,bufs,nbufs,send_handle->stream_ptr,
                write2::anon_class_1_0_00000001::__invoke);
  if ((s != 0) &&
     (p_Var1 = (req->write_cb).super__Function_base._M_manager, p_Var1 != (_Manager_type)0x0)) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
    (req->write_cb).super__Function_base._M_manager = (_Manager_type)0x0;
    (req->write_cb)._M_invoker = (_Invoker_type)0x0;
  }
  eVar2 = make_error(s);
  EVar3._M_value = eVar2._M_value;
  EVar3._4_4_ = eVar2._4_4_;
  register0x00000010 = eVar2._M_cat;
  return EVar3;
}

Assistant:

Error uv11::write2(WriteRequest& req, Stream& stream, Buffer const bufs[], unsigned int nbufs,
    Stream& send_handle, WriteCb const& write_cb)
{
    req.write_cb = write_cb;
    int s = uv_write2(
        &req.Get(),
        &stream.GetStream(),
        bufs, nbufs,
        &send_handle.GetStream(),
        [] (uv_write_t* r, int status) {
            WriteRequest* w = reinterpret_cast<WriteRequest*>(r->data);
            auto w_cb = w->write_cb;
            w->write_cb = nullptr;
            w_cb(*w, make_error(status));
        }
    );

    if (s) req.write_cb = nullptr;

    return make_error(s);
}